

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcBlendEquationAdvancedTests.cpp
# Opt level: O3

IterateResult __thiscall glcts::BlendTestCaseGroup::BlendTest::iterate(BlendTest *this)

{
  ContextInfo *pCVar1;
  RenderContext *renderCtx;
  code *pcVar2;
  RGBA RVar3;
  bool bVar4;
  int iVar5;
  deUint32 dVar6;
  int iVar7;
  undefined4 uVar8;
  int iVar9;
  uint uVar10;
  int iVar11;
  int iVar12;
  undefined4 extraout_var;
  long lVar14;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var15;
  char *layoutQualifier;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  ostream *poVar16;
  TestError *this_00;
  char cVar17;
  GLSLVersion glslVersion;
  uint uVar18;
  uint uVar19;
  char cVar20;
  qpTestResult testResult;
  char cVar21;
  char cVar22;
  char *in_R8;
  uint uVar23;
  uint uVar24;
  BlendTest *pBVar25;
  ulong uVar26;
  uint uVar27;
  uint uVar28;
  char *pcVar29;
  int iVar30;
  uint uVar31;
  long lVar32;
  Vec4 srcCol;
  Vec4 dstCol;
  string frgSrc;
  Vec4 refCol;
  ProgramSources sources;
  ShaderProgram p;
  RGBA local_38c;
  undefined1 local_388 [8];
  undefined8 uStack_380;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_378;
  undefined1 local_368 [8];
  undefined8 uStack_360;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_358;
  void *local_348;
  uint local_33c;
  uint local_338;
  uint local_334;
  uint local_330;
  uint local_32c;
  uint local_328;
  uint local_324;
  uint local_320;
  deUint32 local_31c;
  undefined4 local_318;
  int local_314;
  int local_310;
  RGBA local_30c;
  pointer local_308;
  undefined1 local_300 [8];
  _Alloc_hider local_2f8;
  undefined1 local_2f0 [24];
  int local_2d8;
  VertexArrayPointer local_2d0;
  string local_2b0;
  allocator<char> local_290 [16];
  undefined1 local_280 [8];
  undefined1 local_278 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_268 [3];
  ios_base local_208 [24];
  vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> local_1f0;
  undefined1 local_1d0 [208];
  ShaderProgram local_100;
  int *piVar13;
  undefined4 extraout_var_00;
  
  iVar5 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[4])();
  piVar13 = (int *)CONCAT44(extraout_var,iVar5);
  iVar5 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar14 = CONCAT44(extraout_var_00,iVar5);
  local_308 = (pointer)((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  pCVar1 = ((this->super_TestCase).m_context)->m_contextInfo;
  local_280 = (undefined1  [8])0x1b7fb06;
  _Var15 = std::
           __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<char_const*const>>
                     ((pCVar1->m_extensions).
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (pCVar1->m_extensions).
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish);
  if (_Var15._M_current ==
      (pCVar1->m_extensions).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
               QP_TEST_RESULT_NOT_SUPPORTED,"GL_KHR_blend_equation_advanced");
  }
  else {
    if (this->m_useAllQualifier == false) {
      pcVar29 = GetLayoutQualifierStr(this->m_mode);
    }
    else {
      pcVar29 = "blend_support_all_equations";
    }
    layoutQualifier = glu::getGLSLVersionDeclaration(this->m_glslVersion);
    GetSolidShader_abi_cxx11_
              (&local_2b0,(glcts *)pcVar29,layoutQualifier,
               "#extension GL_KHR_blend_equation_advanced : require",in_R8);
    renderCtx = ((this->super_TestCase).m_context)->m_renderCtx;
    GetDef2DVtxSrc_abi_cxx11_((string *)local_388,(glcts *)(ulong)this->m_glslVersion,glslVersion);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_300,(char *)local_388,local_290);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_368,local_2b0._M_dataplus._M_p,(allocator<char> *)&local_38c);
    memset((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_280,0,0xac);
    local_1d0._0_8_ = (pointer)0x0;
    local_1d0[8] = 0;
    local_1d0._9_7_ = 0;
    local_1d0[0x10] = 0;
    local_1d0._17_8_ = 0;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_280,(value_type *)local_300);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_268,(value_type *)local_368);
    glu::ShaderProgram::ShaderProgram(&local_100,renderCtx,(ProgramSources *)local_280);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_1d0);
    std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
              (&local_1f0);
    lVar32 = 0x78;
    do {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_280 + lVar32));
      lVar32 = lVar32 + -0x18;
    } while (lVar32 != -0x18);
    if (local_368 != (undefined1  [8])&local_358) {
      operator_delete((void *)local_368,local_358._M_allocated_capacity + 1);
    }
    if ((undefined1 *)CONCAT44(local_300._4_4_,local_300._0_4_) != local_2f0) {
      operator_delete((undefined1 *)CONCAT44(local_300._4_4_,local_300._0_4_),local_2f0._0_8_ + 1);
    }
    if (local_388 != (undefined1  [8])&local_378) {
      operator_delete((void *)local_388,local_378._M_allocated_capacity + 1);
    }
    if (local_100.m_program.m_info.linkOk == false) {
      glu::operator<<((TestLog *)local_308,&local_100);
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_00,"Compile failed",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcBlendEquationAdvancedTests.cpp"
                 ,0x3ae);
      __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    (**(code **)(lVar14 + 0x1680))(local_100.m_program.m_program);
    dVar6 = (**(code **)(lVar14 + 0x800))();
    glu::checkError(dVar6,"Program failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcBlendEquationAdvancedTests.cpp"
                    ,0x3b1);
    local_388 = (undefined1  [8])&local_378;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_388,"aPos","");
    local_280._0_4_ = 1;
    local_278._0_8_ = local_268;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_278,local_388,(char *)((long)local_388 + uStack_380));
    local_268[0].field_2._M_allocated_capacity._0_4_ = 0;
    local_300._0_4_ = local_280._0_4_;
    local_2f8._M_p = local_2f0 + 8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_2f8,local_278._0_8_,
               (undefined1 *)
               ((long)&((_Alloc_hider *)local_278._8_8_)->_M_p +
               (long)&((_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_278._0_8_)->_M_impl));
    local_2d8 = (undefined4)local_268[0].field_2._M_allocated_capacity;
    local_2d0.componentType = VTX_COMP_FLOAT;
    local_2d0.convert = VTX_COMP_CONVERT_NONE;
    local_2d0.numComponents = 2;
    local_2d0.numElements = 4;
    local_2d0.stride = 0;
    local_2d0.data = s_pos;
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_278._0_8_ !=
        local_268) {
      operator_delete((void *)local_278._0_8_,(ulong)(local_268[0]._M_dataplus._M_p + 1));
    }
    if (local_388 != (undefined1  [8])&local_378) {
      operator_delete((void *)local_388,local_378._M_allocated_capacity + 1);
    }
    (**(code **)(lVar14 + 0x4e8))(0xbd0);
    (**(code **)(lVar14 + 0x5e0))(0xc11);
    (**(code **)(lVar14 + 0x5e0))(0xbe2);
    (**(code **)(lVar14 + 0x100))(this->m_mode);
    dVar6 = (**(code **)(lVar14 + 0x800))();
    glu::checkError(dVar6,"BlendEquation failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcBlendEquationAdvancedTests.cpp"
                    ,0x3ba);
    pCVar1 = ((this->super_TestCase).m_context)->m_contextInfo;
    local_280 = (undefined1  [8])0x1b7fb25;
    _Var15 = std::
             __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<char_const*const>>
                       ((pCVar1->m_extensions).
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (pCVar1->m_extensions).
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish);
    pBVar25 = this;
    if (0 < this->m_numColors) {
      pBVar25 = (BlendTest *)
                (pCVar1->m_extensions).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      iVar5 = 0;
      do {
        local_388 = (undefined1  [8])0x0;
        uStack_380 = 0;
        local_368 = (undefined1  [8])0x0;
        uStack_360 = 0;
        getTestColors(this,iVar5,(Vec4 *)local_388,(Vec4 *)local_368);
        iVar7 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[4])();
        (**(code **)(lVar14 + 0x1290))
                  ((long)iVar5 % (long)*(int *)CONCAT44(extraout_var_01,iVar7) & 0xffffffff,
                   (long)iVar5 / (long)*(int *)CONCAT44(extraout_var_01,iVar7) & 0xffffffff,1,1);
        (**(code **)(lVar14 + 0x1c0))
                  (local_368._0_4_,local_368._4_4_,(float)uStack_360,uStack_360._4_4_);
        (**(code **)(lVar14 + 0x188))(0x4000);
        if ((BlendTest *)_Var15._M_current == pBVar25) {
          (**(code **)(lVar14 + 0xf0))();
        }
        pcVar2 = *(code **)(lVar14 + 0x15a0);
        uVar8 = (**(code **)(lVar14 + 0xb48))(local_100.m_program.m_program,"uSrcCol");
        (*pcVar2)(local_388._0_4_,local_388._4_4_,(float)uStack_380,uStack_380._4_4_,uVar8);
        dVar6 = (**(code **)(lVar14 + 0x800))();
        glu::checkError(dVar6,"Uniforms failed",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcBlendEquationAdvancedTests.cpp"
                        ,0x3d1);
        local_280 = (undefined1  [8])0x600000000;
        local_278._0_4_ = 1;
        local_278._8_8_ = s_indices;
        glu::draw(((this->super_TestCase).m_context)->m_renderCtx,local_100.m_program.m_program,1,
                  (VertexArrayBinding *)local_300,(PrimitiveList *)local_280,(DrawUtilCallback *)0x0
                 );
        dVar6 = (**(code **)(lVar14 + 0x800))();
        glu::checkError(dVar6,"Draw failed",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcBlendEquationAdvancedTests.cpp"
                        ,0x3d6);
        if ((BlendTest *)_Var15._M_current == pBVar25) {
          (**(code **)(lVar14 + 0xf0))();
        }
        iVar5 = iVar5 + 1;
      } while (iVar5 < this->m_numColors);
    }
    iVar5 = *piVar13;
    iVar7 = piVar13[1];
    local_348 = operator_new__((long)(iVar5 * iVar7 * 4));
    (**(code **)(lVar14 + 0xff0))(0xd05,1);
    (**(code **)(lVar14 + 0x1220))(0,0,iVar5,iVar7,0x1908,0x1401,local_348);
    dVar6 = (**(code **)(lVar14 + 0x800))();
    glu::checkError(dVar6,"Read pixels failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcBlendEquationAdvancedTests.cpp"
                    ,0x3e1);
    if (this->m_numColors < 1) {
      pcVar29 = "Pass";
      testResult = QP_TEST_RESULT_PASS;
    }
    else {
      uVar26 = CONCAT71((int7)((ulong)pBVar25 >> 8),1);
      iVar7 = 0;
      do {
        local_388 = (undefined1  [8])0x0;
        uStack_380 = 0;
        local_368 = (undefined1  [8])0x0;
        uStack_360 = 0;
        getTestColors(this,iVar7,(Vec4 *)local_388,(Vec4 *)local_368);
        iVar9 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[4])();
        iVar30 = iVar7 / *(int *)CONCAT44(extraout_var_02,iVar9);
        iVar9 = iVar7 % *(int *)CONCAT44(extraout_var_02,iVar9);
        Blend((glcts *)local_290,this->m_mode,(Vec4 *)local_388,(Vec4 *)local_368);
        tcu::RGBA::RGBA((RGBA *)local_280,(Vec4 *)local_290);
        cVar17 = (char)piVar13[2];
        if (piVar13[2] == 1) {
          uVar24 = (uint)(int)local_280[0] >> 7 & 0xff;
        }
        else {
          uVar24 = (local_280._0_4_ & 0xff) >> (8U - cVar17 & 0x1f);
          uVar24 = uVar24 >> (cVar17 * '\x02' - 8U & 0x1f) | uVar24 << (8U - cVar17 & 0x1f);
        }
        cVar20 = (char)piVar13[3];
        if (piVar13[3] == 1) {
          uVar23 = (uint)(int)local_280._0_2_ >> 0xf & 0xff;
        }
        else {
          uVar23 = ((uint)local_280._0_4_ >> 8 & 0xff) >> (8U - cVar20 & 0x1f);
          uVar23 = uVar23 >> (cVar20 * '\x02' - 8U & 0x1f) | uVar23 << (8U - cVar20 & 0x1f);
        }
        cVar21 = (char)piVar13[4];
        if (piVar13[4] == 1) {
          uVar18 = (int)(local_280._0_4_ << 8) >> 0x1f & 0xff;
        }
        else {
          uVar18 = ((uint)local_280._0_4_ >> 0x10 & 0xff) >> (8U - cVar21 & 0x1f);
          uVar18 = uVar18 >> (cVar21 * '\x02' - 8U & 0x1f) | uVar18 << (8U - cVar21 & 0x1f);
        }
        iVar11 = piVar13[5];
        cVar22 = (char)iVar11;
        if (iVar11 == 0) {
          uVar10 = 0xff;
        }
        else if (iVar11 == 1) {
          uVar10 = (int)local_280._0_4_ >> 0x1f & 0xff;
        }
        else {
          uVar10 = ((uint)local_280._0_4_ >> 0x18) >> (8U - cVar22 & 0x1f);
          uVar10 = uVar10 >> (cVar22 * '\x02' - 8U & 0x1f) | uVar10 << (8U - cVar22 & 0x1f);
        }
        uVar19 = uVar23 << 8 | uVar24;
        uVar18 = uVar18 << 0x10 | uVar10 << 0x18 | uVar19;
        uVar23 = 0x1000000 << (8U - cVar22 & 0x1f);
        if (iVar11 < 1) {
          uVar23 = 0;
        }
        uVar10 = *(uint *)((long)local_348 + (long)((iVar30 * iVar5 + iVar9) * 4));
        uVar27 = 0x100 << (8U - cVar20 & 0x1f) | 1 << ((byte)(8U - cVar17) & 0x1f);
        uVar23 = 0x10000 << (8U - cVar21 & 0x1f) | uVar27 | uVar23;
        uVar31 = 2 << (8U - cVar17 & 0x1f) & 0x1fe;
        if (0xfc < uVar31) {
          uVar31 = 0xfd;
        }
        uVar27 = uVar27 >> 7 & 0x1fe;
        if (0xfc < uVar27) {
          uVar27 = 0xfd;
        }
        uVar28 = uVar23 >> 0xf & 0x1fe;
        if (0xfc < uVar28) {
          uVar28 = 0xfd;
        }
        uVar23 = uVar23 >> 0x17 & 0xfffffffe;
        if (0xfc < uVar23) {
          uVar23 = 0xfd;
        }
        local_314 = iVar30;
        local_310 = iVar9;
        if (uVar18 != uVar10) {
          local_318 = (undefined4)uVar26;
          uVar28 = uVar28 * 0x10000 + 0x20000 | uVar23 * 0x1000000 + 0x2000000;
          uVar27 = uVar27 * 0x100 + 0x200 | uVar31 + 2;
          local_31c = uVar28 | uVar27;
          local_330 = uVar24 & 0xff;
          local_320 = uVar10 & 0xff;
          uVar23 = local_330 - local_320;
          uVar24 = -uVar23;
          if (0 < (int)uVar23) {
            uVar24 = uVar23;
          }
          local_334 = uVar19 >> 8 & 0xff;
          local_324 = uVar10 >> 8 & 0xff;
          iVar30 = local_334 - local_324;
          iVar9 = -iVar30;
          if (0 < iVar30) {
            iVar9 = iVar30;
          }
          local_338 = uVar18 >> 0x10 & 0xff;
          local_328 = uVar10 >> 0x10 & 0xff;
          iVar11 = local_338 - local_328;
          iVar30 = -iVar11;
          if (0 < iVar11) {
            iVar30 = iVar11;
          }
          local_33c = uVar18 >> 0x18;
          local_32c = uVar10 >> 0x18;
          iVar12 = local_33c - local_32c;
          iVar11 = -iVar12;
          if (0 < iVar12) {
            iVar11 = iVar12;
          }
          local_280._0_4_ = iVar11 << 0x18 | uVar24 | iVar9 << 8 | iVar30 << 0x10;
          bVar4 = tcu::RGBA::isBelowThreshold((RGBA *)local_280,(RGBA)local_31c);
          if (bVar4) {
            uVar26 = (ulong)CONCAT31((int3)((uint)local_318 >> 8),(byte)local_318 & bVar4);
          }
          else {
            local_280 = (undefined1  [8])local_308;
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_278);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278,"(",1);
            std::ostream::operator<<(local_278,local_310);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278,",",1);
            std::ostream::operator<<(local_278,local_314);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278,")  ",3);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278,"(",1);
            std::ostream::operator<<(local_278,iVar7);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278,") ",2);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278,"Exceeds: ",9);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278,"RGBA(",5);
            poVar16 = (ostream *)std::ostream::operator<<(local_278,uVar31 + 2);
            std::__ostream_insert<char,std::char_traits<char>>(poVar16,", ",2);
            poVar16 = (ostream *)std::ostream::operator<<(poVar16,uVar27 >> 8);
            std::__ostream_insert<char,std::char_traits<char>>(poVar16,", ",2);
            poVar16 = (ostream *)std::ostream::operator<<(poVar16,local_31c >> 0x10 & 0xff);
            std::__ostream_insert<char,std::char_traits<char>>(poVar16,", ",2);
            poVar16 = (ostream *)std::ostream::operator<<(poVar16,uVar28 >> 0x18);
            std::__ostream_insert<char,std::char_traits<char>>(poVar16,")",1);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278," diff:",6);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278,"RGBA(",5);
            poVar16 = (ostream *)std::ostream::operator<<((ostringstream *)local_278,uVar24);
            std::__ostream_insert<char,std::char_traits<char>>(poVar16,", ",2);
            uVar24 = iVar30 << 0x10 | uVar24 | iVar11 << 0x18 | iVar9 << 8;
            poVar16 = (ostream *)std::ostream::operator<<(poVar16,uVar24 >> 8 & 0xff);
            std::__ostream_insert<char,std::char_traits<char>>(poVar16,", ",2);
            poVar16 = (ostream *)std::ostream::operator<<(poVar16,uVar24 >> 0x10 & 0xff);
            std::__ostream_insert<char,std::char_traits<char>>(poVar16,", ",2);
            poVar16 = (ostream *)std::ostream::operator<<(poVar16,uVar24 >> 0x18);
            std::__ostream_insert<char,std::char_traits<char>>(poVar16,")",1);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278,"  res:",6);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278,"RGBA(",5);
            poVar16 = (ostream *)std::ostream::operator<<((ostringstream *)local_278,local_320);
            std::__ostream_insert<char,std::char_traits<char>>(poVar16,", ",2);
            poVar16 = (ostream *)std::ostream::operator<<(poVar16,local_324);
            std::__ostream_insert<char,std::char_traits<char>>(poVar16,", ",2);
            poVar16 = (ostream *)std::ostream::operator<<(poVar16,local_328);
            std::__ostream_insert<char,std::char_traits<char>>(poVar16,", ",2);
            poVar16 = (ostream *)std::ostream::operator<<(poVar16,local_32c);
            std::__ostream_insert<char,std::char_traits<char>>(poVar16,")",1);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278,"  ref:",6);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278,"RGBA(",5);
            poVar16 = (ostream *)std::ostream::operator<<((ostringstream *)local_278,local_330);
            std::__ostream_insert<char,std::char_traits<char>>(poVar16,", ",2);
            poVar16 = (ostream *)std::ostream::operator<<(poVar16,local_334);
            std::__ostream_insert<char,std::char_traits<char>>(poVar16,", ",2);
            poVar16 = (ostream *)std::ostream::operator<<(poVar16,local_338);
            std::__ostream_insert<char,std::char_traits<char>>(poVar16,", ",2);
            poVar16 = (ostream *)std::ostream::operator<<(poVar16,local_33c);
            std::__ostream_insert<char,std::char_traits<char>>(poVar16,")",1);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278,"  dst:",6);
            tcu::RGBA::RGBA(&local_38c,(Vec4 *)local_368);
            RVar3.m_value = local_38c.m_value;
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278,"RGBA(",5);
            poVar16 = (ostream *)
                      std::ostream::operator<<((ostringstream *)local_278,RVar3.m_value & 0xff);
            std::__ostream_insert<char,std::char_traits<char>>(poVar16,", ",2);
            poVar16 = (ostream *)std::ostream::operator<<(poVar16,RVar3.m_value >> 8 & 0xff);
            std::__ostream_insert<char,std::char_traits<char>>(poVar16,", ",2);
            poVar16 = (ostream *)std::ostream::operator<<(poVar16,RVar3.m_value >> 0x10 & 0xff);
            std::__ostream_insert<char,std::char_traits<char>>(poVar16,", ",2);
            poVar16 = (ostream *)std::ostream::operator<<(poVar16,RVar3.m_value >> 0x18);
            std::__ostream_insert<char,std::char_traits<char>>(poVar16,")",1);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278,"  src:",6);
            tcu::RGBA::RGBA(&local_30c,(Vec4 *)local_388);
            RVar3.m_value = local_30c.m_value;
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278,"RGBA(",5);
            poVar16 = (ostream *)
                      std::ostream::operator<<((ostringstream *)local_278,RVar3.m_value & 0xff);
            std::__ostream_insert<char,std::char_traits<char>>(poVar16,", ",2);
            poVar16 = (ostream *)std::ostream::operator<<(poVar16,RVar3.m_value >> 8 & 0xff);
            std::__ostream_insert<char,std::char_traits<char>>(poVar16,", ",2);
            poVar16 = (ostream *)std::ostream::operator<<(poVar16,RVar3.m_value >> 0x10 & 0xff);
            std::__ostream_insert<char,std::char_traits<char>>(poVar16,", ",2);
            poVar16 = (ostream *)std::ostream::operator<<(poVar16,RVar3.m_value >> 0x18);
            std::__ostream_insert<char,std::char_traits<char>>(poVar16,")",1);
            tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)local_280,(EndMessageToken *)&tcu::TestLog::EndMessage);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_278);
            std::ios_base::~ios_base(local_208);
            uVar26 = 0;
          }
        }
        iVar7 = iVar7 + 1;
      } while (iVar7 < this->m_numColors);
      testResult = (byte)~(byte)uVar26 & QP_TEST_RESULT_FAIL;
      pcVar29 = "Fail (results differ)";
      if ((uVar26 & 1) != 0) {
        pcVar29 = "Pass";
      }
    }
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,testResult,pcVar29);
    operator_delete__(local_348);
    if (local_2f8._M_p != local_2f0 + 8) {
      operator_delete(local_2f8._M_p,local_2f0._8_8_ + 1);
    }
    glu::ShaderProgram::~ShaderProgram(&local_100);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
      operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1);
    }
  }
  return STOP;
}

Assistant:

BlendTestCaseGroup::BlendTest::IterateResult BlendTestCaseGroup::BlendTest::iterate(void)
{
	const tcu::RenderTarget& rt  = m_context.getRenderContext().getRenderTarget();
	const tcu::PixelFormat&  pf  = rt.getPixelFormat();
	const glw::Functions&	gl  = m_context.getRenderContext().getFunctions();
	TestLog&				 log = m_testCtx.getLog();

	// Check that extension is supported.
	if (!IsExtensionSupported(m_context, "GL_KHR_blend_equation_advanced"))
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_NOT_SUPPORTED, "GL_KHR_blend_equation_advanced");
		return STOP;
	}

	// Setup program.
	std::string frgSrc =
		GetSolidShader(m_useAllQualifier ? "blend_support_all_equations" : GetLayoutQualifierStr(m_mode),
					   glu::getGLSLVersionDeclaration(m_glslVersion));
	glu::ShaderProgram p(m_context.getRenderContext(),
						 glu::makeVtxFragSources(GetDef2DVtxSrc(m_glslVersion).c_str(), frgSrc.c_str()));
	if (!p.isOk())
	{
		log << p;
		TCU_FAIL("Compile failed");
	}
	gl.useProgram(p.getProgram());
	GLU_EXPECT_NO_ERROR(gl.getError(), "Program failed");

	glu::VertexArrayBinding posBinding = glu::va::Float("aPos", 2, 4, 0, &s_pos[0]);

	// Enable blending and set blend equation.
	gl.disable(GL_DITHER);
	gl.enable(GL_SCISSOR_TEST);
	gl.enable(GL_BLEND);
	gl.blendEquation(m_mode);
	GLU_EXPECT_NO_ERROR(gl.getError(), "BlendEquation failed");

	bool needBarrier = !IsExtensionSupported(m_context, "GL_KHR_blend_equation_advanced_coherent");

	// Render loop.
	for (int colorIndex = 0; colorIndex < m_numColors; colorIndex++)
	{
		tcu::Vec4 srcCol, dstCol;
		getTestColors(colorIndex, srcCol, dstCol);

		// Get pixel to blend.
		int x, y;
		getCoordinates(colorIndex, x, y);
		gl.scissor(x, y, 1, 1);

		// Clear to destination color.
		gl.clearColor(dstCol[0], dstCol[1], dstCol[2], dstCol[3]);
		gl.clear(GL_COLOR_BUFFER_BIT);
		if (needBarrier)
			gl.blendBarrier();

		// Set source color.
		gl.uniform4f(gl.getUniformLocation(p.getProgram(), "uSrcCol"), srcCol[0], srcCol[1], srcCol[2], srcCol[3]);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Uniforms failed");

		// Draw.
		glu::draw(m_context.getRenderContext(), p.getProgram(), 1, &posBinding,
				  glu::pr::Triangles(DE_LENGTH_OF_ARRAY(s_indices), &s_indices[0]));
		GLU_EXPECT_NO_ERROR(gl.getError(), "Draw failed");
		if (needBarrier)
			gl.blendBarrier();
	}

	// Read the results.
	const int	 w			  = rt.getWidth();
	const int	 h			  = rt.getHeight();
	glw::GLubyte* resultBytes = new glw::GLubyte[4 * w * h];
	gl.pixelStorei(GL_PACK_ALIGNMENT, 1);
	gl.readPixels(0, 0, w, h, GL_RGBA, GL_UNSIGNED_BYTE, resultBytes);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Read pixels failed");

	bool pass = true;
	for (int colorIndex = 0; colorIndex < m_numColors; colorIndex++)
	{
		tcu::Vec4 srcCol, dstCol;
		getTestColors(colorIndex, srcCol, dstCol);

		// Get result and calculate reference.
		int x, y;
		getCoordinates(colorIndex, x, y);

		tcu::Vec4 refCol	= Blend(m_mode, srcCol, dstCol);
		tcu::RGBA ref		= pf.convertColor(tcu::RGBA(refCol));
		tcu::RGBA res		= tcu::RGBA::fromBytes(resultBytes + 4 * (x + w * y));
		tcu::RGBA tmp		= pf.getColorThreshold();
		tcu::RGBA threshold = tcu::RGBA(std::min(2 + 2 * tmp.getRed(), 255), std::min(2 + 2 * tmp.getGreen(), 255),
										std::min(2 + 2 * tmp.getBlue(), 255), std::min(2 + 2 * tmp.getAlpha(), 255));
		bool pixelOk = tcu::compareThreshold(ref, res, threshold);
		pass		 = pass && pixelOk;
		if (!pixelOk)
		{
			log << TestLog::Message << "(" << x << "," << y << ")  "
				<< "(" << colorIndex << ") "
				<< "Exceeds: " << threshold << " diff:" << tcu::computeAbsDiff(ref, res) << "  res:" << res
				<< "  ref:" << ref << "  dst:" << tcu::RGBA(dstCol) << "  src:" << tcu::RGBA(srcCol)
				<< TestLog::EndMessage;
		}
	}

	m_testCtx.setTestResult(pass ? QP_TEST_RESULT_PASS : QP_TEST_RESULT_FAIL, pass ? "Pass" : "Fail (results differ)");
	delete[] resultBytes;
	return STOP;
}